

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_kinematics.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  time_t tVar2;
  Scalar *pSVar3;
  ostream *poVar4;
  int i;
  long lVar5;
  int i_1;
  ulong uVar6;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pDVar7;
  Matrix4d *pMVar8;
  byte bVar9;
  Vector6d theta;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  theta_q;
  Matrix4d *local_300;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *local_2f8;
  Matrix4d *local_2f0;
  Vector6d local_2e8;
  long local_2b8 [16];
  Matrix4d T;
  Matrix4d local_1b8;
  Matrix4d local_138;
  Matrix4d T14;
  
  bVar9 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    iVar1 = rand();
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)&theta,lVar5);
    *pSVar3 = ((double)(iVar1 % 100) / 100.0) * 3.141592653589793;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"theta: ");
  T.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&theta;
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                     *)&T);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
       theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
       theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
       theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
       theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
       theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
       theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  forward_kinematics(&T,&local_2e8);
  poVar4 = std::operator<<((ostream *)&std::cout,"T:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&T);
  std::endl<char,std::char_traits<char>>(poVar4);
  transform((Matrix4d *)&theta_q,1,
            theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
            array[1]);
  transform((Matrix4d *)local_2b8,2,
            theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
            array[2]);
  transform(&local_138,3,
            theta.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
            array[3]);
  local_300 = (Matrix4d *)&theta_q;
  local_2f8 = (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)local_2b8;
  local_2f0 = &local_138;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&T14,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
              *)&local_300);
  pDVar7 = (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&T;
  pMVar8 = &local_1b8;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = *(double *)pDVar7;
    pDVar7 = pDVar7 + (ulong)bVar9 * -0x10 + 8;
    pMVar8 = (Matrix4d *)((long)pMVar8 + ((ulong)bVar9 * -2 + 1) * 8);
  }
  inverse_kinematics(&theta_q,&local_1b8);
  lVar5 = 0;
  for (uVar6 = 0;
      uVar6 < (ulong)(((long)theta_q.
                             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)theta_q.
                            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar6 = uVar6 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"theta_e: ");
    local_2b8[0] = (long)((theta_q.
                           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.
                         m_data.array + lVar5;
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                       *)local_2b8);
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar5 = lVar5 + 0x30;
  }
  std::
  _Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~_Vector_base(&theta_q.
                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 );
  return 0;
}

Assistant:

int main()
{

	srand(time(0));
	Vector6d theta;
	// theta <<  2.04204,  1.19381,  1.31947,  1.25664, 0.251327, 0.345575;
	for (int i = 0; i < 6; i++)
	{
		// theta(i) = 0;//i * M_PI / 2;
		theta(i) = rand() % 100 / 100.0 * M_PI;
	}

	cout << "theta: " << theta.transpose() << endl;

	Matrix4d T = forward_kinematics(theta);
	cout << "T:\n" << T << endl;
	Matrix4d T14 = transform(1, theta(1)) * transform(2, theta(2)) * transform(3, theta(3));
	vector<Vector6d> theta_q = inverse_kinematics(T);
	for(int i = 0; i < theta_q.size(); i++)
	{
		cout << "theta_e: " << theta_q[i].transpose() << endl;
	}
	return 0;
}